

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upsampling_sse2.c
# Opt level: O0

void Yuv444ToRgb565_SSE2(uint8_t *y,uint8_t *u,uint8_t *v,uint8_t *dst,int len)

{
  uint uVar1;
  uint8_t *in_RCX;
  uint8_t *in_RDI;
  uint in_R8D;
  uint8_t *unaff_retaddr;
  uint8_t *in_stack_00000008;
  int max_len;
  int i;
  uint8_t *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar2;
  
  uVar1 = in_R8D & 0xffffffe0;
  for (iVar2 = 0; iVar2 < (int)uVar1; iVar2 = iVar2 + 0x20) {
    VP8YuvToRgb56532_SSE2((uint8_t *)CONCAT44(len,i),in_stack_00000008,unaff_retaddr,in_RDI);
  }
  if (iVar2 < (int)in_R8D) {
    WebPYuv444ToRgb565_C
              (in_RCX,(uint8_t *)CONCAT44(in_R8D,iVar2),
               (uint8_t *)CONCAT44(uVar1,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8,0);
  }
  return;
}

Assistant:

WEBP_TSAN_IGNORE_FUNCTION void WebPInitYUV444ConvertersSSE2(void) {
  WebPYUV444Converters[MODE_RGBA]      = Yuv444ToRgba_SSE2;
  WebPYUV444Converters[MODE_BGRA]      = Yuv444ToBgra_SSE2;
  WebPYUV444Converters[MODE_rgbA]      = Yuv444ToRgba_SSE2;
  WebPYUV444Converters[MODE_bgrA]      = Yuv444ToBgra_SSE2;
#if !defined(WEBP_REDUCE_CSP)
  WebPYUV444Converters[MODE_RGB]       = Yuv444ToRgb_SSE2;
  WebPYUV444Converters[MODE_BGR]       = Yuv444ToBgr_SSE2;
  WebPYUV444Converters[MODE_ARGB]      = Yuv444ToArgb_SSE2;
  WebPYUV444Converters[MODE_RGBA_4444] = Yuv444ToRgba4444_SSE2;
  WebPYUV444Converters[MODE_RGB_565]   = Yuv444ToRgb565_SSE2;
  WebPYUV444Converters[MODE_Argb]      = Yuv444ToArgb_SSE2;
  WebPYUV444Converters[MODE_rgbA_4444] = Yuv444ToRgba4444_SSE2;
#endif   // WEBP_REDUCE_CSP
}